

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,char *message)

{
  char *in_RCX;
  int in_EDX;
  char *in_RSI;
  ScopedTrace *in_RDI;
  char *local_70;
  allocator local_41;
  string local_40 [2];
  
  local_70 = in_RCX;
  if (in_RCX == (char *)0x0) {
    local_70 = "(null)";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,local_70,&local_41);
  PushTrace(in_RDI,in_RSI,in_EDX,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const char* message) {
    PushTrace(file, line, message ? message : "(null)");
  }